

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O2

bool __thiscall
IRT::MoveFromMemByRegToMemByReg::TryToGenerateCode
          (MoveFromMemByRegToMemByReg *this,INode *tree,CTemp *dest,ChildrenTemps *children,
          AssemblyCommands *commands)

{
  CMoveStatement *this_00;
  CExpression *pCVar1;
  CMemExpression *this_01;
  CMemExpression *this_02;
  CTempExpression *this_03;
  CTempExpression *this_04;
  CTemp rightRegister;
  CTemp leftRegister;
  pair<IRT::CTemp,_const_IRT::INode_*> local_c0;
  pair<IRT::CTemp,_const_IRT::CExpression_*> local_98;
  CTemp local_70;
  CTemp local_50;
  
  if (tree != (INode *)0x0) {
    this_00 = (CMoveStatement *)__dynamic_cast(tree,&INode::typeinfo,&CMoveStatement::typeinfo,0);
    if (this_00 == (CMoveStatement *)0x0) {
      return false;
    }
    pCVar1 = CMoveStatement::Target(this_00);
    if (pCVar1 == (CExpression *)0x0) {
      this_01 = (CMemExpression *)0x0;
    }
    else {
      this_01 = (CMemExpression *)
                __dynamic_cast(pCVar1,&CExpression::typeinfo,&CMemExpression::typeinfo,0);
    }
    pCVar1 = CMoveStatement::Source(this_00);
    if (pCVar1 != (CExpression *)0x0) {
      this_02 = (CMemExpression *)
                __dynamic_cast(pCVar1,&CExpression::typeinfo,&CMemExpression::typeinfo,0);
      if (this_02 == (CMemExpression *)0x0 || this_01 == (CMemExpression *)0x0) {
        return false;
      }
      pCVar1 = CMemExpression::getAddress(this_01);
      if (pCVar1 == (CExpression *)0x0) {
        this_03 = (CTempExpression *)0x0;
      }
      else {
        this_03 = (CTempExpression *)
                  __dynamic_cast(pCVar1,&CExpression::typeinfo,&CTempExpression::typeinfo,0);
      }
      pCVar1 = CMemExpression::getAddress(this_02);
      if (pCVar1 == (CExpression *)0x0) {
        this_04 = (CTempExpression *)0x0;
      }
      else {
        this_04 = (CTempExpression *)
                  __dynamic_cast(pCVar1,&CExpression::typeinfo,&CTempExpression::typeinfo,0);
      }
      CTemp::CTemp(&local_50);
      CTemp::CTemp(&local_70);
      if (this_03 == (CTempExpression *)0x0) {
        pCVar1 = CMemExpression::getAddress(this_01);
        std::__cxx11::string::string((string *)&local_98,(string *)&local_50);
        local_98.second = pCVar1;
        std::pair<IRT::CTemp,_const_IRT::INode_*>::pair<IRT::CTemp,_const_IRT::CExpression_*,_true>
                  (&local_c0,&local_98);
        std::
        vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
        ::emplace_back<std::pair<IRT::CTemp,IRT::INode_const*>>
                  ((vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
                    *)children,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_98);
      }
      else {
        CTempExpression::getTemprorary(this_03);
        std::__cxx11::string::_M_assign((string *)&local_50);
      }
      if (this_04 == (CTempExpression *)0x0) {
        pCVar1 = CMemExpression::getAddress(this_02);
        std::__cxx11::string::string((string *)&local_98,(string *)&local_70);
        local_98.second = pCVar1;
        std::pair<IRT::CTemp,_const_IRT::INode_*>::pair<IRT::CTemp,_const_IRT::CExpression_*,_true>
                  (&local_c0,&local_98);
        std::
        vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
        ::emplace_back<std::pair<IRT::CTemp,IRT::INode_const*>>
                  ((vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
                    *)children,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_98);
      }
      else {
        CTempExpression::getTemprorary(this_04);
        std::__cxx11::string::_M_assign((string *)&local_70);
      }
      std::make_shared<AssemblyCode::MoveRegFromMemToMemByReg,IRT::CTemp&,IRT::CTemp&>
                (&local_c0.first,&local_50);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::MoveRegFromMemToMemByReg>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)commands,(shared_ptr<AssemblyCode::MoveRegFromMemToMemByReg> *)&local_c0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c0.first.name._M_string_length
                );
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      return true;
    }
  }
  return false;
}

Assistant:

bool IRT::MoveFromMemByRegToMemByReg::TryToGenerateCode( const IRT::INode *tree, const IRT::CTemp &dest,
                                                         ChildrenTemps &children, AssemblyCommands &commands ) {
    ConstMovePtr movePtr = dynamic_cast<ConstMovePtr>(tree);
    if ( movePtr ) {
        ConstMemPtr leftMemPtr = dynamic_cast<ConstMemPtr>(movePtr->Target( ));
        ConstMemPtr rightMemPtr = dynamic_cast<ConstMemPtr>(movePtr->Source( ));
        if ( leftMemPtr && rightMemPtr ) {
            ConstTempPtr targetRegPtr = dynamic_cast<ConstTempPtr>(leftMemPtr->getAddress( ));
            ConstTempPtr sourceRegPtr = dynamic_cast<ConstTempPtr>(rightMemPtr->getAddress( ));
            CTemp leftRegister;
            CTemp rightRegister;
            if ( !targetRegPtr ) {
                children.push_back( std::make_pair( leftRegister, leftMemPtr->getAddress( )));
            } else {
                leftRegister = targetRegPtr->getTemprorary( );
            }
            if ( !sourceRegPtr ) {
                children.push_back( std::make_pair( rightRegister, rightMemPtr->getAddress( )));
            } else {
                rightRegister = sourceRegPtr->getTemprorary( );
            }
            commands.emplace_back( std::make_shared<AssemblyCode::MoveRegFromMemToMemByReg>( leftRegister,
                                                                                             rightRegister ));
            return true;
        }
    }
    return false;
}